

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnd.c
# Opt level: O2

double Exponential(double dMean,long nStream)

{
  long lVar1;
  long lVar2;
  double dVar3;
  
  dVar3 = 0.0;
  if (0.0 < dMean) {
    lVar2 = 0;
    if ((ulong)nStream < 0x32) {
      lVar2 = nStream;
    }
    lVar1 = NextRand(Seed[lVar2].value);
    Seed[lVar2].value = lVar1;
    dVar3 = log((double)lVar1 / -2147483647.0 + 1.0);
    dVar3 = dVar3 * -dMean;
  }
  return dVar3;
}

Assistant:

double
Exponential(double dMean, long nStream)

/*
 * Returns a double uniformly distributed with mean dMean.  
 * 0.0 is returned iff dMean <= 0.0. nStream is the random number 
 * stream. Stream 0 is used if nStream is not in the range 
 * 0..MAX_STREAM.
 */

{
    double          dTemp;

    if (nStream < 0 || nStream > MAX_STREAM)
        nStream = 0;
    if (dMean <= 0.0)
        return (0.0);

    Seed[nStream].value = NextRand(Seed[nStream].value);
    dTemp = (double) Seed[nStream].value / dM;        /* unif between 0..1 */
    return (-dMean * log(1.0 - dTemp));
}